

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void state_M4X4(Context *ctx)

{
  int in_EDX;
  int extraout_EDX;
  
  if ((ctx->dest_arg).writemask != 0xf) {
    fail(ctx,"M4X4 writemask must be full");
    in_EDX = extraout_EDX;
  }
  srcarg_matrix_replicate(ctx,4,in_EDX);
  return;
}

Assistant:

static void state_M4X4(Context *ctx)
{
    const DestArgInfo *info = &ctx->dest_arg;
    if (!writemask_xyzw(info->writemask))
        fail(ctx, "M4X4 writemask must be full");

// !!! FIXME: MSDN:
//The xyzw (default) mask is required for the destination register. Negate and swizzle modifiers are allowed for src0, but not for src1.
//Swizzle and negate modifiers are invalid for the src0 register. The dest and src0 registers cannot be the same.

    srcarg_matrix_replicate(ctx, 1, 4);
}